

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink6.c
# Opt level: O3

Gia_Man_t * Shr_ManFree(Shr_Man_t *p)

{
  Gia_Man_t **p_00;
  Gia_Man_t *pGVar1;
  Vec_Wrd_t *pVVar2;
  word *pwVar3;
  int *piVar4;
  int iVar5;
  Gia_Man_t *pGVar6;
  Vec_Int_t *pVVar7;
  
  p_00 = &p->pNew;
  Gia_ManHashStop(p->pNew);
  pGVar1 = p->pNew;
  pVVar7 = pGVar1->vLevels;
  if (pVVar7 != (Vec_Int_t *)0x0) {
    if (pVVar7->pArray != (int *)0x0) {
      free(pVVar7->pArray);
      pGVar1->vLevels->pArray = (int *)0x0;
      pVVar7 = pGVar1->vLevels;
      if (pVVar7 == (Vec_Int_t *)0x0) goto LAB_007cef3b;
    }
    free(pVVar7);
    pGVar1->vLevels = (Vec_Int_t *)0x0;
  }
LAB_007cef3b:
  iVar5 = Gia_ManHasDangling(*p_00);
  if (iVar5 != 0) {
    pGVar1 = *p_00;
    pGVar6 = Gia_ManCleanup(pGVar1);
    *p_00 = pGVar6;
    if (~(pGVar6->vCos->nSize + pGVar6->vCis->nSize) + pGVar6->nObjs !=
        ~(pGVar1->vCos->nSize + pGVar1->vCis->nSize) + pGVar1->nObjs) {
      printf("Node reduction after sweep %6d -> %6d.\n");
    }
    Gia_ManStop(pGVar1);
  }
  Gia_ManSetRegNum(p->pNew,p->pGia->nRegs);
  pGVar1 = p->pNew;
  p->pNew = (Gia_Man_t *)0x0;
  Rsb_ManFree(p->pManRsb);
  Bdc_ManFree(p->pManDec);
  Gia_ManStopP(p_00);
  pVVar2 = p->vFanMem;
  pwVar3 = pVVar2->pArray;
  if (pwVar3 != (word *)0x0) {
    free(pwVar3);
  }
  free(pVVar2);
  pVVar7 = p->vObj2Fan;
  piVar4 = pVVar7->pArray;
  if (piVar4 != (int *)0x0) {
    free(piVar4);
  }
  free(pVVar7);
  pVVar7 = p->vDivs;
  piVar4 = pVVar7->pArray;
  if (piVar4 != (int *)0x0) {
    free(piVar4);
  }
  free(pVVar7);
  pVVar7 = p->vPrio;
  piVar4 = pVVar7->pArray;
  if (piVar4 != (int *)0x0) {
    free(piVar4);
  }
  free(pVVar7);
  pVVar2 = p->vTruths;
  pwVar3 = pVVar2->pArray;
  if (pwVar3 != (word *)0x0) {
    free(pwVar3);
  }
  free(pVVar2);
  pVVar2 = p->vDivTruths;
  pwVar3 = pVVar2->pArray;
  if (pwVar3 != (word *)0x0) {
    free(pwVar3);
  }
  free(pVVar2);
  pVVar7 = p->vDivResub;
  piVar4 = pVVar7->pArray;
  if (piVar4 != (int *)0x0) {
    free(piVar4);
  }
  free(pVVar7);
  pVVar7 = p->vLeaves;
  piVar4 = pVVar7->pArray;
  if (piVar4 != (int *)0x0) {
    free(piVar4);
  }
  free(pVVar7);
  free(p);
  return pGVar1;
}

Assistant:

Gia_Man_t * Shr_ManFree( Shr_Man_t * p )
{
    // prepare the manager
    Gia_Man_t * pTemp;
    Gia_ManHashStop( p->pNew );
    Vec_IntFreeP( &p->pNew->vLevels );
    if ( Gia_ManHasDangling(p->pNew) )
    {
        p->pNew = Gia_ManCleanup( pTemp = p->pNew );
        if ( Gia_ManAndNum(p->pNew) != Gia_ManAndNum(pTemp) )
            printf( "Node reduction after sweep %6d -> %6d.\n", Gia_ManAndNum(pTemp), Gia_ManAndNum(p->pNew) );
        Gia_ManStop( pTemp );
    }
    Gia_ManSetRegNum( p->pNew, Gia_ManRegNum(p->pGia) );
    pTemp = p->pNew; p->pNew = NULL;
    // free data structures
    Rsb_ManFree( p->pManRsb );
    Bdc_ManFree( p->pManDec );
    Gia_ManStopP( &p->pNew );
    Vec_WrdFree( p->vFanMem );
    Vec_IntFree( p->vObj2Fan );
    Vec_IntFree( p->vDivs );
    Vec_IntFree( p->vPrio );
    Vec_WrdFree( p->vTruths );
    Vec_WrdFree( p->vDivTruths );
    Vec_IntFree( p->vDivResub );
    Vec_IntFree( p->vLeaves );
    ABC_FREE( p );
    return pTemp;
}